

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spolynomials.cpp
# Opt level: O3

void opengv::relative_pose::modules::fivept_kneip::sPolynomial63
               (Matrix<double,_66,_197,_0,_66,_197> *groebnerMatrix)

{
  double dVar1;
  double dVar2;
  
  dVar1 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x2922];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x83d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2964] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x87f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x29a6] / dVar1;
  dVar2 = (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
          m_storage.m_data.array[0x27c4];
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x903] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x28cc] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x9c9] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x29e8] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x128d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2bf8] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x12cf] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2c3a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1353] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2cbe] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1395] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d00] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x166b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2d84] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1839] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2dc6] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1bd5] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e08] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c17] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e4a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c59] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2e8c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1c9b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2ece] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1cdd] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f10] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1e27] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f52] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x1fb3] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2f94] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2181] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x2fd6] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2391] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3018] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x276f] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x305a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x27b1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x309c] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x27f3] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x30de] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2835] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3120] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2877] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3162] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x29c1] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31a4] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b4d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x31e6] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2b8f] =
       (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
       m_storage.m_data.array[0x31d2] / dVar2;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2d1b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x3228] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x2f2b] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x326a] / dVar1;
  (groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).m_storage.
  m_data.array[0x317d] =
       -(groebnerMatrix->super_PlainObjectBase<Eigen::Matrix<double,_66,_197,_0,_66,_197>_>).
        m_storage.m_data.array[0x32ac] / dVar1;
  return;
}

Assistant:

void
opengv::relative_pose::modules::fivept_kneip::sPolynomial63( Eigen::Matrix<double,66,197> & groebnerMatrix )
{
  groebnerMatrix(63,31) = -groebnerMatrix(36,160)/(groebnerMatrix(36,159));
  groebnerMatrix(63,32) = -groebnerMatrix(36,161)/(groebnerMatrix(36,159));
  groebnerMatrix(63,34) = groebnerMatrix(16,158)/(groebnerMatrix(16,154));
  groebnerMatrix(63,37) = -groebnerMatrix(36,162)/(groebnerMatrix(36,159));
  groebnerMatrix(63,71) = -groebnerMatrix(36,170)/(groebnerMatrix(36,159));
  groebnerMatrix(63,72) = -groebnerMatrix(36,171)/(groebnerMatrix(36,159));
  groebnerMatrix(63,74) = -groebnerMatrix(36,173)/(groebnerMatrix(36,159));
  groebnerMatrix(63,75) = -groebnerMatrix(36,174)/(groebnerMatrix(36,159));
  groebnerMatrix(63,86) = -groebnerMatrix(36,176)/(groebnerMatrix(36,159));
  groebnerMatrix(63,93) = -groebnerMatrix(36,177)/(groebnerMatrix(36,159));
  groebnerMatrix(63,107) = -groebnerMatrix(36,178)/(groebnerMatrix(36,159));
  groebnerMatrix(63,108) = -groebnerMatrix(36,179)/(groebnerMatrix(36,159));
  groebnerMatrix(63,109) = -groebnerMatrix(36,180)/(groebnerMatrix(36,159));
  groebnerMatrix(63,110) = -groebnerMatrix(36,181)/(groebnerMatrix(36,159));
  groebnerMatrix(63,111) = -groebnerMatrix(36,182)/(groebnerMatrix(36,159));
  groebnerMatrix(63,116) = -groebnerMatrix(36,183)/(groebnerMatrix(36,159));
  groebnerMatrix(63,122) = -groebnerMatrix(36,184)/(groebnerMatrix(36,159));
  groebnerMatrix(63,129) = -groebnerMatrix(36,185)/(groebnerMatrix(36,159));
  groebnerMatrix(63,137) = -groebnerMatrix(36,186)/(groebnerMatrix(36,159));
  groebnerMatrix(63,152) = -groebnerMatrix(36,187)/(groebnerMatrix(36,159));
  groebnerMatrix(63,153) = -groebnerMatrix(36,188)/(groebnerMatrix(36,159));
  groebnerMatrix(63,154) = -groebnerMatrix(36,189)/(groebnerMatrix(36,159));
  groebnerMatrix(63,155) = -groebnerMatrix(36,190)/(groebnerMatrix(36,159));
  groebnerMatrix(63,156) = -groebnerMatrix(36,191)/(groebnerMatrix(36,159));
  groebnerMatrix(63,161) = -groebnerMatrix(36,192)/(groebnerMatrix(36,159));
  groebnerMatrix(63,167) = -groebnerMatrix(36,193)/(groebnerMatrix(36,159));
  groebnerMatrix(63,168) = groebnerMatrix(16,193)/(groebnerMatrix(16,154));
  groebnerMatrix(63,174) = -groebnerMatrix(36,194)/(groebnerMatrix(36,159));
  groebnerMatrix(63,182) = -groebnerMatrix(36,195)/(groebnerMatrix(36,159));
  groebnerMatrix(63,191) = -groebnerMatrix(36,196)/(groebnerMatrix(36,159));
}